

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service.cxx
# Opt level: O0

int __thiscall nuraft::asio_rpc_listener::listen(asio_rpc_listener *this,int __fd,int __n)

{
  int extraout_EAX;
  undefined4 in_register_00000034;
  lock_guard<std::mutex> guard;
  lock_guard<std::mutex> *in_stack_000000e0;
  asio_rpc_listener *in_stack_000000e8;
  shared_ptr<nuraft::raft_server> *this_00;
  shared_ptr<nuraft::raft_server> local_18;
  asio_rpc_listener *local_8;
  
  local_18.super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(in_register_00000034,__fd);
  this_00 = &local_18;
  local_8 = this;
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)this_00,(mutex_type *)this);
  std::shared_ptr<nuraft::raft_server>::operator=(this_00,(shared_ptr<nuraft::raft_server> *)this);
  this->stopped_ = false;
  start(in_stack_000000e8,in_stack_000000e0);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x28ae3a);
  return extraout_EAX;
}

Assistant:

virtual void listen(ptr<msg_handler>& handler) override {
        std::lock_guard<std::mutex> guard(listener_lock_);
        handler_ = handler;
        stopped_ = false;
        start(guard);
    }